

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::ArrayBase::insertAt(ArrayBase *this,uint32_t index,uint8_t *value)

{
  uint8_t *value_local;
  uint32_t index_local;
  ArrayBase *this_local;
  
  if (this->size < index) {
    __assert_fail("index >= 0 && index <= size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,999,"void xatlas::internal::ArrayBase::insertAt(uint32_t, const uint8_t *)");
  }
  if (value != (uint8_t *)0x0) {
    resize(this,this->size + 1,false);
    if (this->buffer == (uint8_t *)0x0) {
      __assert_fail("buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                    ,0x3ea,"void xatlas::internal::ArrayBase::insertAt(uint32_t, const uint8_t *)");
    }
    if ((this->buffer != (uint8_t *)0x0) && (index < this->size - 1)) {
      memmove(this->buffer + this->elementSize * (index + 1),
              this->buffer + this->elementSize * index,
              (ulong)(this->elementSize * ((this->size - 1) - index)));
    }
    if ((this->buffer != (uint8_t *)0x0) && (value != (uint8_t *)0x0)) {
      memcpy(this->buffer + index * this->elementSize,value,(ulong)this->elementSize);
    }
    return;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,1000,"void xatlas::internal::ArrayBase::insertAt(uint32_t, const uint8_t *)");
}

Assistant:

void insertAt(uint32_t index, const uint8_t *value)
	{
		XA_DEBUG_ASSERT(index >= 0 && index <= size);
		XA_DEBUG_ASSERT(value);
		resize(size + 1, false);
		XA_DEBUG_ASSERT(buffer);
		if (buffer && index < size - 1)
			memmove(buffer + elementSize * (index + 1), buffer + elementSize * index, elementSize * (size - 1 - index));
		if (buffer && value)
			memcpy(&buffer[index * elementSize], value, elementSize);
	}